

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_read_ppm(opj_j2k_t *j2k)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  long in_RDI;
  opj_cio_t *cio;
  opj_cp_t *cp;
  int N_ppm;
  int j;
  int i;
  int Z_ppm;
  int len;
  int in_stack_ffffffffffffffcc;
  opj_cio_t *cio_00;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_RDI + 0x60);
  cio_00 = *(opj_cio_t **)(in_RDI + 0x70);
  uVar2 = cio_read(cio_00,in_stack_ffffffffffffffcc);
  *(undefined4 *)(lVar1 + 0x70) = 1;
  uVar3 = cio_read(cio_00,in_stack_ffffffffffffffcc);
  local_c = uVar2 - 3;
  do {
    if (local_c < 1) {
      return;
    }
    if (*(int *)(lVar1 + 0x78) == 0) {
      local_1c = cio_read(cio_00,in_stack_ffffffffffffffcc);
      local_c = local_c + -4;
    }
    else {
      local_1c = *(uint *)(lVar1 + 0x78);
    }
    local_18 = *(int *)(lVar1 + 0x74);
    if (uVar3 == 0) {
      pvVar4 = malloc((long)(int)local_1c);
      *(void **)(lVar1 + 0x60) = pvVar4;
      *(undefined8 *)(lVar1 + 0x68) = *(undefined8 *)(lVar1 + 0x60);
      *(uint *)(lVar1 + 0x7c) = local_1c;
    }
    else {
      pvVar4 = realloc(*(void **)(lVar1 + 0x60),(long)(int)(local_1c + *(int *)(lVar1 + 0x74)));
      *(void **)(lVar1 + 0x60) = pvVar4;
      *(undefined8 *)(lVar1 + 0x68) = *(undefined8 *)(lVar1 + 0x60);
      *(uint *)(lVar1 + 0x7c) = local_1c + *(int *)(lVar1 + 0x74);
    }
    for (local_14 = local_1c; 0 < (int)local_14; local_14 = local_14 - 1) {
      uVar2 = cio_read(cio_00,in_stack_ffffffffffffffcc);
      *(char *)(*(long *)(lVar1 + 0x60) + (long)local_18) = (char)uVar2;
      local_18 = local_18 + 1;
      local_c = local_c + -1;
      if (local_c == 0) break;
    }
    *(uint *)(lVar1 + 0x78) = local_14 - 1;
    *(int *)(lVar1 + 0x74) = local_18;
  } while( true );
}

Assistant:

static void j2k_read_ppm(opj_j2k_t *j2k) {
	int len, Z_ppm, i, j;
	int N_ppm;

	opj_cp_t *cp = j2k->cp;
	opj_cio_t *cio = j2k->cio;
	
	len = cio_read(cio, 2);
	cp->ppm = 1;
	
	Z_ppm = cio_read(cio, 1);	/* Z_ppm */
	len -= 3;
	while (len > 0) {
		if (cp->ppm_previous == 0) {
			N_ppm = cio_read(cio, 4);	/* N_ppm */
			len -= 4;
		} else {
			N_ppm = cp->ppm_previous;
		}
		j = cp->ppm_store;
		if (Z_ppm == 0) {	/* First PPM marker */
			cp->ppm_data = (unsigned char *) opj_malloc(N_ppm * sizeof(unsigned char));
			cp->ppm_data_first = cp->ppm_data;
			cp->ppm_len = N_ppm;
		} else {			/* NON-first PPM marker */
			cp->ppm_data = (unsigned char *) opj_realloc(cp->ppm_data, (N_ppm +	cp->ppm_store) * sizeof(unsigned char));

#ifdef USE_JPWL
			/* this memory allocation check could be done even in non-JPWL cases */
			if (cp->correct) {
				if (!cp->ppm_data) {
					opj_event_msg(j2k->cinfo, EVT_ERROR,
						"JPWL: failed memory allocation during PPM marker parsing (pos. %x)\n",
						cio_tell(cio));
					if (!JPWL_ASSUME || JPWL_ASSUME) {
						opj_free(cp->ppm_data);
						opj_event_msg(j2k->cinfo, EVT_ERROR, "JPWL: giving up\n");
						return;
					}
				}
			}
#endif

			cp->ppm_data_first = cp->ppm_data;
			cp->ppm_len = N_ppm + cp->ppm_store;
		}
		for (i = N_ppm; i > 0; i--) {	/* Read packet header */
			cp->ppm_data[j] = cio_read(cio, 1);
			j++;
			len--;
			if (len == 0)
				break;			/* Case of non-finished packet header in present marker but finished in next one */
		}
		cp->ppm_previous = i - 1;
		cp->ppm_store = j;
	}
}